

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_decompress.c
# Opt level: O2

size_t HUF_readDTableX1_wksp
                 (HUF_DTable *DTable,void *src,size_t srcSize,void *workSpace,size_t wkspSize,
                 int flags)

{
  BYTE *huffWeight;
  undefined1 uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  int iVar9;
  char cVar10;
  undefined1 uVar11;
  long *plVar12;
  long lVar13;
  U32 UVar14;
  ulong uVar15;
  long lVar16;
  U32 local_88;
  U32 nbSymbols;
  long local_80;
  int local_74;
  size_t local_70;
  long local_68;
  long local_60;
  HUF_DTable *local_58;
  HUF_DTable *local_50;
  HUF_DTable *local_48;
  ulong local_40;
  ulong local_38;
  
  local_88 = 0;
  nbSymbols = 0;
  local_70 = 0xffffffffffffffd4;
  if (0x5d3 < wkspSize) {
    huffWeight = (BYTE *)((long)workSpace + 0x4d4);
    local_70 = HUF_readStats_wksp(huffWeight,0x100,(U32 *)workSpace,&nbSymbols,&local_88,src,srcSize
                                  ,(void *)((long)workSpace + 0x68),0x36c,flags);
    if (local_70 < 0xffffffffffffff89) {
      uVar2 = *DTable;
      uVar4 = (uVar2 & 0xff) + 1;
      uVar15 = 0xb;
      if (uVar4 < 0xb) {
        uVar15 = (ulong)uVar4;
      }
      UVar14 = (U32)uVar15;
      if (local_88 < UVar14 || local_88 - UVar14 == 0) {
        if (local_88 < UVar14) {
          uVar4 = UVar14 - local_88;
          for (uVar7 = 0; nbSymbols != uVar7; uVar7 = uVar7 + 1) {
            cVar10 = '\0';
            if (huffWeight[uVar7] != '\0') {
              cVar10 = (char)uVar4;
            }
            huffWeight[uVar7] = cVar10 + huffWeight[uVar7];
          }
          for (; uVar4 < uVar15; uVar15 = uVar15 - 1) {
            *(undefined4 *)((long)workSpace + uVar15 * 4) =
                 *(undefined4 *)((long)workSpace + (ulong)((local_88 - UVar14) + (int)uVar15) * 4);
          }
          for (lVar5 = (ulong)uVar4 << 2; lVar5 != 0; lVar5 = lVar5 + -4) {
            *(undefined4 *)((long)workSpace + lVar5) = 0;
          }
        }
      }
      else {
        UVar14 = local_88;
        if (uVar4 < local_88) {
          return 0xffffffffffffffd4;
        }
      }
      local_88 = UVar14;
      *(char *)DTable = (char)uVar2;
      *(undefined1 *)((long)DTable + 1) = 0;
      *(char *)((long)DTable + 2) = (char)local_88;
      *(char *)((long)DTable + 3) = (char)(uVar2 >> 0x18);
      iVar9 = 0;
      for (lVar5 = 0; lVar5 <= (int)local_88; lVar5 = lVar5 + 1) {
        iVar3 = *(int *)((long)workSpace + lVar5 * 4);
        *(int *)((long)workSpace + lVar5 * 4 + 0x34) = iVar9;
        iVar9 = iVar3 + iVar9;
      }
      for (lVar5 = 0; lVar16 = lVar5, lVar8 = 4, lVar5 < (long)(int)nbSymbols + -3;
          lVar5 = lVar5 + 4) {
        while (lVar8 != 0) {
          uVar15 = (ulong)*(byte *)((long)workSpace + lVar16 + 0x4d4);
          uVar2 = *(uint *)((long)workSpace + uVar15 * 4 + 0x34);
          *(uint *)((long)workSpace + uVar15 * 4 + 0x34) = uVar2 + 1;
          *(char *)((long)workSpace + (ulong)uVar2 + 0x3d4) = (char)lVar16;
          lVar16 = lVar16 + 1;
          lVar8 = lVar8 + -1;
        }
      }
      for (; lVar5 < (int)nbSymbols; lVar5 = lVar5 + 1) {
        uVar15 = (ulong)*(byte *)((long)workSpace + lVar5 + 0x4d4);
        uVar2 = *(uint *)((long)workSpace + uVar15 * 4 + 0x34);
        *(uint *)((long)workSpace + uVar15 * 4 + 0x34) = uVar2 + 1;
        *(char *)((long)workSpace + (ulong)uVar2 + 0x3d4) = (char)lVar5;
      }
      local_74 = *workSpace;
      local_40 = (ulong)(local_88 + 1);
      local_80 = (long)workSpace + 0x3d4;
      local_50 = DTable + 3;
      local_58 = DTable + 1;
      local_60 = (long)DTable + 7;
      local_68 = (long)DTable + 5;
      local_48 = DTable + 7;
      local_38 = 0;
      for (uVar15 = 1; uVar15 < local_40; uVar15 = uVar15 + 1) {
        uVar2 = *(uint *)((long)workSpace + uVar15 * 4);
        iVar9 = (1 << ((byte)uVar15 & 0x1f)) >> 1;
        uVar4 = (local_88 + 1) - (int)uVar15;
        lVar16 = (long)(int)local_38;
        lVar5 = (long)local_74;
        uVar11 = (undefined1)uVar4;
        switch(iVar9) {
        case 1:
          uVar7 = 0;
          if (0 < (int)uVar2) {
            uVar7 = (ulong)uVar2;
          }
          lVar16 = local_68 + lVar16 * 2;
          for (uVar6 = 0; uVar7 != uVar6; uVar6 = uVar6 + 1) {
            uVar1 = *(undefined1 *)(lVar5 + local_80 + uVar6);
            *(undefined1 *)(lVar16 + -1 + uVar6 * 2) = uVar11;
            *(undefined1 *)(lVar16 + uVar6 * 2) = uVar1;
          }
          break;
        case 2:
          uVar7 = 0;
          if (0 < (int)uVar2) {
            uVar7 = (ulong)uVar2;
          }
          lVar16 = local_60 + lVar16 * 2;
          for (uVar6 = 0; uVar7 != uVar6; uVar6 = uVar6 + 1) {
            uVar1 = *(undefined1 *)(lVar5 + local_80 + uVar6);
            *(undefined1 *)(lVar16 + -3 + uVar6 * 4) = uVar11;
            *(undefined1 *)(lVar16 + -2 + uVar6 * 4) = uVar1;
            *(undefined1 *)(lVar16 + -1 + uVar6 * 4) = uVar11;
            *(undefined1 *)(lVar16 + uVar6 * 4) = uVar1;
          }
          break;
        default:
          uVar7 = 0;
          if (0 < (int)uVar2) {
            uVar7 = (ulong)uVar2;
          }
          lVar16 = (long)local_48 + lVar16 * 2;
          for (uVar6 = 0; uVar6 != uVar7; uVar6 = uVar6 + 1) {
            lVar8 = ((ulong)*(byte *)((long)workSpace + uVar6 + lVar5 + 0x3d4) << 8 |
                    (ulong)(uVar4 & 0xff)) * 0x1000100010001;
            for (lVar13 = 0; lVar13 < iVar9; lVar13 = lVar13 + 0x10) {
              *(long *)(lVar16 + -0x18 + lVar13 * 2) = lVar8;
              *(long *)(lVar16 + -0x10 + lVar13 * 2) = lVar8;
              *(long *)(lVar16 + -8 + lVar13 * 2) = lVar8;
              *(long *)(lVar16 + lVar13 * 2) = lVar8;
            }
            if (iVar9 != (int)lVar13) {
              __assert_fail("u == length",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/huf_decompress.c"
                            ,0x1e1,
                            "size_t HUF_readDTableX1_wksp(HUF_DTable *, const void *, size_t, void *, size_t, int)"
                           );
            }
            lVar16 = lVar16 + (long)iVar9 * 2;
          }
          break;
        case 4:
          uVar7 = 0;
          if (0 < (int)uVar2) {
            uVar7 = (ulong)uVar2;
          }
          for (uVar6 = 0; uVar7 != uVar6; uVar6 = uVar6 + 1) {
            *(ulong *)((long)local_58 + uVar6 * 8 + lVar16 * 2) =
                 ((ulong)*(byte *)(lVar5 + local_80 + uVar6) << 8 | (ulong)(uVar4 & 0xff)) *
                 0x1000100010001;
          }
          break;
        case 8:
          uVar7 = 0;
          if (0 < (int)uVar2) {
            uVar7 = (ulong)uVar2;
          }
          plVar12 = (long *)((long)local_50 + lVar16 * 2);
          for (uVar6 = 0; uVar7 != uVar6; uVar6 = uVar6 + 1) {
            lVar16 = ((ulong)*(byte *)(lVar5 + local_80 + uVar6) << 8 | (ulong)(uVar4 & 0xff)) *
                     0x1000100010001;
            plVar12[-1] = lVar16;
            *plVar12 = lVar16;
            plVar12 = plVar12 + 2;
          }
        }
        local_74 = local_74 + uVar2;
        local_38 = (ulong)((int)local_38 + iVar9 * uVar2);
      }
    }
  }
  return local_70;
}

Assistant:

size_t HUF_readDTableX1_wksp(HUF_DTable* DTable, const void* src, size_t srcSize, void* workSpace, size_t wkspSize, int flags)
{
    U32 tableLog = 0;
    U32 nbSymbols = 0;
    size_t iSize;
    void* const dtPtr = DTable + 1;
    HUF_DEltX1* const dt = (HUF_DEltX1*)dtPtr;
    HUF_ReadDTableX1_Workspace* wksp = (HUF_ReadDTableX1_Workspace*)workSpace;

    DEBUG_STATIC_ASSERT(HUF_DECOMPRESS_WORKSPACE_SIZE >= sizeof(*wksp));
    if (sizeof(*wksp) > wkspSize) return ERROR(tableLog_tooLarge);

    DEBUG_STATIC_ASSERT(sizeof(DTableDesc) == sizeof(HUF_DTable));
    /* ZSTD_memset(huffWeight, 0, sizeof(huffWeight)); */   /* is not necessary, even though some analyzer complain ... */

    iSize = HUF_readStats_wksp(wksp->huffWeight, HUF_SYMBOLVALUE_MAX + 1, wksp->rankVal, &nbSymbols, &tableLog, src, srcSize, wksp->statsWksp, sizeof(wksp->statsWksp), flags);
    if (HUF_isError(iSize)) return iSize;


    /* Table header */
    {   DTableDesc dtd = HUF_getDTableDesc(DTable);
        U32 const maxTableLog = dtd.maxTableLog + 1;
        U32 const targetTableLog = MIN(maxTableLog, HUF_DECODER_FAST_TABLELOG);
        tableLog = HUF_rescaleStats(wksp->huffWeight, wksp->rankVal, nbSymbols, tableLog, targetTableLog);
        if (tableLog > (U32)(dtd.maxTableLog+1)) return ERROR(tableLog_tooLarge);   /* DTable too small, Huffman tree cannot fit in */
        dtd.tableType = 0;
        dtd.tableLog = (BYTE)tableLog;
        ZSTD_memcpy(DTable, &dtd, sizeof(dtd));
    }

    /* Compute symbols and rankStart given rankVal:
     *
     * rankVal already contains the number of values of each weight.
     *
     * symbols contains the symbols ordered by weight. First are the rankVal[0]
     * weight 0 symbols, followed by the rankVal[1] weight 1 symbols, and so on.
     * symbols[0] is filled (but unused) to avoid a branch.
     *
     * rankStart contains the offset where each rank belongs in the DTable.
     * rankStart[0] is not filled because there are no entries in the table for
     * weight 0.
     */
    {   int n;
        U32 nextRankStart = 0;
        int const unroll = 4;
        int const nLimit = (int)nbSymbols - unroll + 1;
        for (n=0; n<(int)tableLog+1; n++) {
            U32 const curr = nextRankStart;
            nextRankStart += wksp->rankVal[n];
            wksp->rankStart[n] = curr;
        }
        for (n=0; n < nLimit; n += unroll) {
            int u;
            for (u=0; u < unroll; ++u) {
                size_t const w = wksp->huffWeight[n+u];
                wksp->symbols[wksp->rankStart[w]++] = (BYTE)(n+u);
            }
        }
        for (; n < (int)nbSymbols; ++n) {
            size_t const w = wksp->huffWeight[n];
            wksp->symbols[wksp->rankStart[w]++] = (BYTE)n;
        }
    }

    /* fill DTable
     * We fill all entries of each weight in order.
     * That way length is a constant for each iteration of the outer loop.
     * We can switch based on the length to a different inner loop which is
     * optimized for that particular case.
     */
    {   U32 w;
        int symbol = wksp->rankVal[0];
        int rankStart = 0;
        for (w=1; w<tableLog+1; ++w) {
            int const symbolCount = wksp->rankVal[w];
            int const length = (1 << w) >> 1;
            int uStart = rankStart;
            BYTE const nbBits = (BYTE)(tableLog + 1 - w);
            int s;
            int u;
            switch (length) {
            case 1:
                for (s=0; s<symbolCount; ++s) {
                    HUF_DEltX1 D;
                    D.byte = wksp->symbols[symbol + s];
                    D.nbBits = nbBits;
                    dt[uStart] = D;
                    uStart += 1;
                }
                break;
            case 2:
                for (s=0; s<symbolCount; ++s) {
                    HUF_DEltX1 D;
                    D.byte = wksp->symbols[symbol + s];
                    D.nbBits = nbBits;
                    dt[uStart+0] = D;
                    dt[uStart+1] = D;
                    uStart += 2;
                }
                break;
            case 4:
                for (s=0; s<symbolCount; ++s) {
                    U64 const D4 = HUF_DEltX1_set4(wksp->symbols[symbol + s], nbBits);
                    MEM_write64(dt + uStart, D4);
                    uStart += 4;
                }
                break;
            case 8:
                for (s=0; s<symbolCount; ++s) {
                    U64 const D4 = HUF_DEltX1_set4(wksp->symbols[symbol + s], nbBits);
                    MEM_write64(dt + uStart, D4);
                    MEM_write64(dt + uStart + 4, D4);
                    uStart += 8;
                }
                break;
            default:
                for (s=0; s<symbolCount; ++s) {
                    U64 const D4 = HUF_DEltX1_set4(wksp->symbols[symbol + s], nbBits);
                    for (u=0; u < length; u += 16) {
                        MEM_write64(dt + uStart + u + 0, D4);
                        MEM_write64(dt + uStart + u + 4, D4);
                        MEM_write64(dt + uStart + u + 8, D4);
                        MEM_write64(dt + uStart + u + 12, D4);
                    }
                    assert(u == length);
                    uStart += length;
                }
                break;
            }
            symbol += symbolCount;
            rankStart += symbolCount * length;
        }
    }
    return iSize;
}